

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transparency.cpp
# Opt level: O1

void __thiscall Transparency::Transparency(Transparency *this,Json *conf,BSDF *base)

{
  const_reference pvVar1;
  ScalarImage *this_00;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"base");
  BSDF::BSDF(&this->super_BSDF,pvVar1);
  (this->super_BSDF)._vptr_BSDF = (_func_int **)&PTR_f_0016cbc8;
  this->base = base;
  this->alphaTexture = (ScalarImage *)0x0;
  this_00 = (ScalarImage *)operator_new(0x10);
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"alpha");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_60,pvVar1);
  getpath(&local_40,&local_60);
  ScalarImage::ScalarImage(this_00,&local_40);
  this->alphaTexture = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (base != (BSDF *)0x0) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "transparency: unrecognized base material";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

Transparency::Transparency(const Json& conf, BSDF* base):
	BSDF(conf["base"]), base(base)
{
	alphaTexture = new ScalarImage(getpath(conf["alpha"]));
	if (base == NULL)
		throw "transparency: unrecognized base material";
}